

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanContentCharList(QXmlStreamReaderPrivate *this)

{
  QStringView s;
  bool bVar1;
  uint uVar2;
  qsizetype qVar3;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  qsizetype pos;
  uint c;
  qsizetype n;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffff50;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffff58;
  QStringView *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff98;
  unsigned_short uVar4;
  undefined2 uVar5;
  long local_60;
  qsizetype local_50;
  QChar local_44;
  QChar local_42 [15];
  QChar local_24;
  char16_t local_22;
  QChar local_c;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = 0;
LAB_006557dc:
  do {
    uVar2 = getChar((QXmlStreamReaderPrivate *)
                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    uVar4 = (unsigned_short)uVar2;
    if (uVar2 == 0xffffffff) {
      local_50 = local_60;
LAB_00655bdb:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_50;
    }
    in_stack_ffffffffffffff74 = uVar2 & 0xffff;
    if (in_stack_ffffffffffffff74 == 0) {
LAB_0065587b:
      putChar(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      local_50 = local_60;
      goto LAB_00655bdb;
    }
    if (in_stack_ffffffffffffff74 != 9) {
      if (in_stack_ffffffffffffff74 != 10) {
        if (in_stack_ffffffffffffff74 != 0xd) {
          if (in_stack_ffffffffffffff74 == 0x20) goto LAB_00655af4;
          if ((in_stack_ffffffffffffff74 == 0x26) || (in_stack_ffffffffffffff74 == 0x3c)) {
            if ((uVar2 & 0xff0000) == 0) {
              putChar(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
              local_50 = local_60;
              goto LAB_00655bdb;
            }
          }
          else {
            if (in_stack_ffffffffffffff74 == 0x5d) {
              *(ushort *)&in_RDI->field_0x3a8 = *(ushort *)&in_RDI->field_0x3a8 & 0xfffd;
              qVar3 = QString::size(&in_RDI->textBuffer);
              QChar::QChar<unsigned_short,_true>(&local_a,uVar4);
              QString::operator+=((QString *)in_stack_ffffffffffffff50,
                                  (QChar)(char16_t)((ulong)in_stack_ffffffffffffff58 >> 0x30));
              while( true ) {
                local_60 = local_60 + 1;
                uVar2 = getChar((QXmlStreamReaderPrivate *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
                uVar4 = (unsigned_short)uVar2;
                uVar5 = (undefined2)(uVar2 >> 0x10);
                if (uVar2 != 0x5d) break;
                QChar::QChar<unsigned_short,_true>(&local_c,uVar4);
                QString::operator+=((QString *)in_stack_ffffffffffffff50,
                                    (QChar)(char16_t)((ulong)in_stack_ffffffffffffff58 >> 0x30));
              }
              if (uVar2 == 0xffffffff) {
                QStringView::QStringView<QString,_true>
                          (in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58);
                s.m_data._0_4_ = in_stack_ffffffffffffff98;
                s.m_size = qVar3;
                s.m_data._4_2_ = uVar4;
                s.m_data._6_2_ = uVar5;
                putString(in_RDI,s,CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
                QString::resize((QString *)in_stack_ffffffffffffff50,
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
              }
              else {
                in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 & 0xffffff;
                if (uVar2 == 0x3e) {
                  QString::size(&in_RDI->textBuffer);
                  local_22 = (char16_t)
                             QString::at((QString *)in_stack_ffffffffffffff58,
                                         (qsizetype)in_stack_ffffffffffffff50);
                  QChar::QChar<char16_t,_true>(&local_24,L']');
                  bVar1 = ::operator==((QChar *)in_stack_ffffffffffffff50,
                                       (QChar *)CONCAT44(in_stack_ffffffffffffff4c,
                                                         in_stack_ffffffffffffff48));
                  in_stack_ffffffffffffff70 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff70);
                }
                if ((char)(in_stack_ffffffffffffff70 >> 0x18) == '\0') {
                  putChar(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
                  goto LAB_006557dc;
                }
                QXmlStream::tr((char *)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                               in_stack_ffffffffffffff4c);
                raiseWellFormedError
                          (in_stack_ffffffffffffff50,
                           (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
                ;
                QString::~QString((QString *)0x655a5d);
              }
              local_50 = local_60;
              goto LAB_00655bdb;
            }
            if (in_stack_ffffffffffffff74 == 0xfffe || in_stack_ffffffffffffff74 == 0xffff)
            goto LAB_0065587b;
          }
          if (uVar2 < 0x20) {
            putChar(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
            local_50 = local_60;
            goto LAB_00655bdb;
          }
          *(ushort *)&in_RDI->field_0x3a8 = *(ushort *)&in_RDI->field_0x3a8 & 0xfffd;
          QChar::QChar<unsigned_short,_true>(&local_44,uVar4);
          QString::operator+=((QString *)in_stack_ffffffffffffff50,
                              (QChar)(char16_t)((ulong)in_stack_ffffffffffffff58 >> 0x30));
          local_60 = local_60 + 1;
          goto LAB_006557dc;
        }
        uVar2 = filterCarriageReturn(in_stack_ffffffffffffff58);
        uVar4 = (unsigned_short)uVar2;
        if (uVar2 == 0) {
          local_50 = local_60;
          goto LAB_00655bdb;
        }
      }
      in_RDI->lineNumber = in_RDI->lineNumber + 1;
      in_RDI->lastLineStart = in_RDI->characterOffset + in_RDI->readBufferPos;
    }
LAB_00655af4:
    QChar::QChar<unsigned_short,_true>(local_42,uVar4);
    QString::operator+=((QString *)in_stack_ffffffffffffff50,
                        (QChar)(char16_t)((ulong)in_stack_ffffffffffffff58 >> 0x30));
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanContentCharList()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (ushort(c)) {
        case 0xfffe:
        case 0xffff:
        case 0:
            putChar(c);
            return n;
        case ']': {
            isWhitespace = false;
            const qsizetype pos = textBuffer.size();
            textBuffer += QChar(ushort(c));
            ++n;
            while ((c = getChar()) == ']') {
                textBuffer += QChar(ushort(c));
                ++n;
            }
            if (c == StreamEOF) {
                putString(textBuffer, pos);
                textBuffer.resize(pos);
            } else if (c == '>' && textBuffer.at(textBuffer.size() - 2) == u']') {
                raiseWellFormedError(QXmlStream::tr("Sequence ']]>' not allowed in content."));
            } else {
                putChar(c);
                break;
            }
            return n;
        } break;
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            textBuffer += QChar(ushort(c));
            ++n;
            break;
        case '&':
        case '<':
            if (!(c & 0xff0000)) {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            if (c < 0x20) {
                putChar(c);
                return n;
            }
            isWhitespace = false;
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }
    return n;
}